

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

StreamingConcatenationExpressionSyntax * __thiscall
slang::parsing::Parser::parseStreamConcatenation(Parser *this,Token openBrace)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token operatorToken;
  Token openBrace_00;
  Token innerOpenBrace;
  Token innerCloseBrace;
  bool bVar1;
  StreamingConcatenationExpressionSyntax *pSVar2;
  Info *in_RDI;
  Token TVar3;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_000000c0;
  Token *in_stack_000000c8;
  TokenKind in_stack_000000d2;
  TokenKind in_stack_000000d4;
  TokenKind in_stack_000000d6;
  ParserBase *in_stack_000000d8;
  Token closeBrace;
  RequireItems in_stack_000000f8;
  DiagCode in_stack_00000100;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeBraceInner;
  Token openBraceInner;
  ExpressionSyntax *sliceSize;
  Token op;
  Parser *in_stack_fffffffffffffe90;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *this_00;
  undefined4 uVar4;
  undefined2 in_stack_fffffffffffffe9c;
  TokenKind in_stack_fffffffffffffe9e;
  ParserBase *in_stack_fffffffffffffea0;
  __extent_storage<18446744073709551615UL> _Var5;
  ParserBase *in_stack_fffffffffffffeb0;
  Info *pIVar6;
  ExpressionSyntax *pEVar7;
  Token in_stack_ffffffffffffff08;
  TokenKind in_stack_ffffffffffffff1e;
  ParserBase *in_stack_ffffffffffffff20;
  SyntaxFactory *local_90;
  Info *local_88;
  undefined1 local_80 [12];
  undefined4 local_74;
  undefined8 local_70;
  Info *local_68;
  Info *local_60;
  ExpressionSyntax *local_58;
  ExpressionSyntax *local_40;
  Token local_38;
  
  local_38 = ParserBase::consume(in_stack_fffffffffffffeb0);
  local_40 = (ExpressionSyntax *)0x0;
  bVar1 = ParserBase::peek(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
  if (!bVar1) {
    local_40 = parseExpression(in_stack_fffffffffffffe90);
  }
  Token::Token((Token *)in_stack_fffffffffffffe90);
  Token::Token((Token *)in_stack_fffffffffffffe90);
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x8ac95c);
  local_74 = 0x520005;
  _Var5._M_extent_value = (size_t)local_80;
  this_00 = (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)CONCAT44(uVar4,1);
  uVar4 = 0x520005;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfBracedList,slang::parsing::Parser::parseStreamConcatenation(slang::parsing::Token)::__0>
            (in_stack_000000d8,in_stack_000000d6,in_stack_000000d4,in_stack_000000d2,
             in_stack_000000c8,in_stack_000000c0,(Token *)closeBrace.info,in_stack_000000f8,
             in_stack_00000100,(anon_class_8_1_8991fb9c *)list._M_ptr,
             (AllowEmpty)list._M_extent._M_extent_value);
  TVar3 = ParserBase::expect(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1e);
  pIVar6 = in_RDI + 0xe;
  elements._M_ptr._4_2_ = in_stack_fffffffffffffe9c;
  elements._M_ptr._0_4_ = uVar4;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffe9e;
  elements._M_extent._M_extent_value = _Var5._M_extent_value;
  pEVar7 = local_40;
  slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::SeparatedSyntaxList
            (this_00,elements);
  local_90 = TVar3._0_8_;
  local_88 = TVar3.info;
  openBrace_00.info = in_RDI;
  openBrace_00._0_8_ = pEVar7;
  operatorToken.info = pIVar6;
  operatorToken._0_8_ = local_88;
  innerOpenBrace.info = local_60;
  innerOpenBrace._0_8_ = local_88;
  innerCloseBrace.info = local_68;
  innerCloseBrace.kind = (short)local_70;
  innerCloseBrace._2_1_ = (char)((ulong)local_70 >> 0x10);
  innerCloseBrace.numFlags.raw = (char)((ulong)local_70 >> 0x18);
  innerCloseBrace.rawLen = (int)((ulong)local_70 >> 0x20);
  pSVar2 = slang::syntax::SyntaxFactory::streamingConcatenationExpression
                     (local_90,openBrace_00,operatorToken,local_58,innerOpenBrace,
                      (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)local_58,
                      innerCloseBrace,in_stack_ffffffffffffff08);
  return pSVar2;
}

Assistant:

StreamingConcatenationExpressionSyntax& Parser::parseStreamConcatenation(Token openBrace) {
    auto op = consume();
    ExpressionSyntax* sliceSize = nullptr;
    if (!peek(TokenKind::OpenBrace))
        sliceSize = &parseExpression();

    Token openBraceInner;
    Token closeBraceInner;
    std::span<TokenOrSyntax> list;

    parseList<isPossibleExpressionOrComma, isEndOfBracedList>(
        TokenKind::OpenBrace, TokenKind::CloseBrace, TokenKind::Comma, openBraceInner, list,
        closeBraceInner, RequireItems::True, diag::ExpectedStreamExpression,
        [this] { return &parseStreamExpression(); });

    auto closeBrace = expect(TokenKind::CloseBrace);
    return factory.streamingConcatenationExpression(openBrace, op, sliceSize, openBraceInner, list,
                                                    closeBraceInner, closeBrace);
}